

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSD.cpp
# Opt level: O3

void findMatch(vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor1,
              vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor2,
              vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint1,
              vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint2,
              vector<cv::DMatch,_std::allocator<cv::DMatch>_> *dMatch,int threshold)

{
  pointer *ppDVar1;
  pointer pDVar2;
  pointer pDVar3;
  iterator __position;
  float fVar4;
  pointer pDVar5;
  pointer pDVar6;
  KeyPoint *pKVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Descriptor desp2;
  Descriptor desp1;
  float local_190;
  float local_18c;
  undefined8 local_138;
  Point2f local_128;
  undefined1 local_110 [8];
  bool abStack_108 [8];
  undefined8 local_100;
  int local_f8;
  undefined8 local_a0;
  undefined1 local_98;
  Mat local_90 [96];
  
  pDVar5 = (keyPointDescriptor1->super__Vector_base<Descriptor,_std::allocator<Descriptor>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (keyPointDescriptor1->super__Vector_base<Descriptor,_std::allocator<Descriptor>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pDVar5 != pDVar2) {
    fVar4 = 0.0;
    do {
      local_98 = pDVar5->isPaired;
      local_a0._0_4_ = pDVar5->x;
      local_a0._4_4_ = pDVar5->y;
      cv::Mat::Mat(local_90,&pDVar5->v);
      pDVar6 = (keyPointDescriptor2->super__Vector_base<Descriptor,_std::allocator<Descriptor>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pDVar3 = (keyPointDescriptor2->super__Vector_base<Descriptor,_std::allocator<Descriptor>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pDVar6 == pDVar3) {
        fVar10 = 0.0;
        fVar11 = 0.0;
        pKVar7 = (KeyPoint *)0x0;
        local_18c = 3.4028235e+38;
        local_190 = 3.4028235e+38;
        fVar8 = 0.0;
        fVar9 = 0.0;
      }
      else {
        local_128.x = 0.0;
        local_128.y = 0.0;
        local_190 = 3.4028235e+38;
        local_18c = 3.4028235e+38;
        pKVar7 = (KeyPoint *)0x0;
        local_138 = 0;
        do {
          abStack_108[0] = pDVar6->isPaired;
          local_110._0_4_ = pDVar6->x;
          local_110._4_4_ = pDVar6->y;
          cv::Mat::Mat((Mat *)&local_100,&pDVar6->v);
          if (abStack_108[0] == false) {
            fVar8 = getDistance(local_90,(Mat *)&local_100);
            if (local_18c <= fVar8) {
              fVar9 = fVar8;
              if (local_190 <= fVar8) goto LAB_0010766f;
            }
            else {
              local_138 = local_a0;
              local_128.x = (float)local_110._0_4_;
              local_128.y = (float)local_110._4_4_;
              pKVar7 = (KeyPoint *)local_110;
              fVar9 = local_18c;
              local_18c = fVar8;
            }
          }
          else {
LAB_0010766f:
            fVar9 = local_190;
          }
          local_190 = fVar9;
          cv::Mat::~Mat((Mat *)&local_100);
          pDVar6 = pDVar6 + 1;
        } while (pDVar6 != pDVar3);
        fVar8 = (float)(int)local_138;
        fVar9 = (float)local_138._4_4_;
        fVar10 = (float)(int)local_128.x;
        fVar11 = (float)(int)local_128.y;
      }
      if ((local_18c <= (float)threshold) && (local_18c / local_190 <= 0.8)) {
        local_110._4_4_ = fVar9;
        local_110._0_4_ = fVar8;
        abStack_108 = (bool  [8])0xbf80000040a00000;
        local_100._0_4_ = 0.0;
        local_100._4_4_ = 0;
        local_f8 = -1;
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                  (keyPoint1,(KeyPoint *)local_110);
        local_110._4_4_ = fVar11;
        local_110._0_4_ = fVar10;
        abStack_108 = (bool  [8])0xbf80000040a00000;
        local_100._0_4_ = 0.0;
        local_100._4_4_ = 0;
        local_f8 = -1;
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                  (keyPoint2,(KeyPoint *)local_110);
        local_110._4_4_ = fVar4;
        local_110._0_4_ = fVar4;
        abStack_108 = (bool  [8])0x40400000ffffffff;
        __position._M_current =
             (dMatch->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (dMatch->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::_M_realloc_insert<cv::DMatch>
                    (dMatch,__position,(DMatch *)local_110);
        }
        else {
          (__position._M_current)->queryIdx = (int)fVar4;
          (__position._M_current)->trainIdx = (int)fVar4;
          (__position._M_current)->imgIdx = -1;
          (__position._M_current)->distance = 3.0;
          ppDVar1 = &(dMatch->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
        }
        fVar4 = (float)((int)fVar4 + 1);
        *(undefined1 *)&pKVar7->size = 1;
      }
      cv::Mat::~Mat(local_90);
      pDVar5 = pDVar5 + 1;
    } while (pDVar5 != pDVar2);
  }
  return;
}

Assistant:

void findMatch(vector<Descriptor>& keyPointDescriptor1, vector<Descriptor>& keyPointDescriptor2, vector<KeyPoint>& keyPoint1, vector<KeyPoint>& keyPoint2, vector<DMatch>& dMatch, int threshold) {
	int idx = 0;
	for (Descriptor desp1 : keyPointDescriptor1) {
		Point bestPoint1;
		Point bestPoint2;
		Descriptor* bestDesp2=NULL;
		float bestDist = numeric_limits<float>::max();
		Point secondPoint1;
		Point secondPoint2;
		float secondDist = bestDist;
		for (Descriptor desp2 : keyPointDescriptor2) {
			//skip the keypoint if it has already been paired
			if (desp2.isPaired) continue;

			float dist = getDistance(desp1.v, desp2.v);
			if (dist < bestDist) {
				secondDist = bestDist;
				secondPoint1 = bestPoint1;
				secondPoint2 = bestPoint2;
				bestDist = dist;
				bestPoint1 = Point(desp1.x, desp1.y);
				bestPoint2 = Point(desp2.x, desp2.y);
				bestDesp2 = &desp2;
			}
			else if (dist < secondDist) {
				secondDist = dist;
				secondPoint1 = Point(desp1.x, desp1.y);
				secondPoint2 = Point(desp2.x, desp2.y);
			}
		}
		if (bestDist > threshold) continue;
		float ratio = bestDist / secondDist;
		if (ratio <= 0.8) {
			keyPoint1.push_back(KeyPoint(bestPoint1, 5));
			keyPoint2.push_back(KeyPoint(bestPoint2, 5));
			dMatch.push_back(DMatch(idx, idx, 3));
			++idx;
			(*bestDesp2).isPaired = true;
		}
	}
}